

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rand.cpp
# Opt level: O0

void __thiscall
ON_RandomNumberGenerator::TwoGaussians(ON_RandomNumberGenerator *this,double *u,double *v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double m;
  double s;
  double t;
  double *v_local;
  double *u_local;
  ON_RandomNumberGenerator *this_local;
  
  if ((u != (double *)0x0) && (v != (double *)0x0)) {
    s = RandomDouble(this);
    dVar1 = RandomDouble(this);
    if ((s < 1e-20) || (1.0 < s)) {
      s = 0.5;
    }
    dVar2 = log(s);
    dVar2 = sqrt(dVar2 * -2.0);
    dVar3 = cos(dVar1 * 6.283185307179586);
    *u = dVar2 * dVar3;
    dVar1 = sin(dVar1 * 6.283185307179586);
    *v = dVar2 * dVar1;
  }
  return;
}

Assistant:

void ON_RandomNumberGenerator::TwoGaussians(double* u, double* v)
{
  if (!u || !v) return;
  double t = RandomDouble();
  double s = RandomDouble();
  // if there is a problem with the random number generator, we don't want to crash the FPU in the logarithm
  if (t < 1e-20 || t > 1.0)  
    t = .5;
  double m = sqrt(-2.0 * log(t));
  *u = m * cos(ON_2PI * s);
  *v = m * sin(ON_2PI * s);
}